

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulation.cpp
# Opt level: O0

bool __thiscall
TRM::Triangulation::check_intersection
          (Triangulation *this,Edge *left,Edge *right,ActiveEdgeList *ael,Vertex **current)

{
  vec2 vVar1;
  bool bVar2;
  uint uVar3;
  bool local_79;
  Vertex *local_78;
  bool local_6a;
  bool local_69;
  Vertex *local_60;
  Vertex *next;
  Vertex *prev;
  Vertex *top;
  Vertex *v;
  vec2 p;
  Vertex **current_local;
  ActiveEdgeList *ael_local;
  Edge *right_local;
  Edge *left_local;
  Triangulation *this_local;
  
  if ((left == (Edge *)0x0) || (right == (Edge *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    p = (vec2)current;
    bVar2 = Edge::intersect(left,right,(vec2 *)&v);
    if (((bVar2) && (uVar3 = std::isinf((double)(ulong)(uint)v._0_4_), (uVar3 & 1) == 0)) &&
       (uVar3 = std::isinf((double)(ulong)(uint)v._4_4_), (uVar3 & 1) == 0)) {
      prev = *(Vertex **)p;
      while( true ) {
        local_69 = false;
        if (prev != (Vertex *)0x0) {
          local_69 = VertexCompare::Compare((vec2 *)&v,&prev->point);
        }
        if (local_69 == false) break;
        prev = prev->prev;
      }
      bVar2 = glm::operator==((vec<2,_float,_(glm::qualifier)0> *)&v,&left->top->point);
      if (bVar2) {
        top = left->top;
      }
      else {
        bVar2 = glm::operator==((vec<2,_float,_(glm::qualifier)0> *)&v,&left->bottom->point);
        if (bVar2) {
          top = left->bottom;
        }
        else {
          bVar2 = glm::operator==((vec<2,_float,_(glm::qualifier)0> *)&v,&right->top->point);
          if (bVar2) {
            top = right->top;
          }
          else {
            bVar2 = glm::operator==((vec<2,_float,_(glm::qualifier)0> *)&v,&right->bottom->point);
            if (bVar2) {
              top = right->bottom;
            }
            else {
              next = prev;
              while( true ) {
                local_6a = false;
                if (next != (Vertex *)0x0) {
                  local_6a = VertexCompare::Compare((vec2 *)&v,&next->point);
                }
                if (local_6a == false) break;
                next = next->prev;
              }
              if (next == (Vertex *)0x0) {
                local_78 = (this->mesh_).super_LinkedList<TRM::Vertex>.head;
              }
              else {
                local_78 = next->next;
              }
              local_60 = local_78;
              while( true ) {
                local_79 = false;
                if (local_60 != (Vertex *)0x0) {
                  local_79 = VertexCompare::Compare(&local_60->point,(vec2 *)&v);
                }
                if (local_79 == false) break;
                next = local_60;
                local_60 = local_60->next;
              }
              if ((next == (Vertex *)0x0) ||
                 (bVar2 = glm::operator==(&next->point,(vec<2,_float,_(glm::qualifier)0> *)&v),
                 !bVar2)) {
                if ((local_60 == (Vertex *)0x0) ||
                   (bVar2 = glm::operator==(&local_60->point,(vec<2,_float,_(glm::qualifier)0> *)&v)
                   , !bVar2)) {
                  top = ObjectHeap::Allocate<TRM::Vertex,glm::vec<2,float,(glm::qualifier)0>&>
                                  (&this->heap_,(vec<2,_float,_(glm::qualifier)0> *)&v);
                  vVar1.field_1 = v._4_4_;
                  vVar1.field_0 = v._0_4_;
                  top->point = vVar1;
                  VertexList::insert(&this->mesh_,top,next,local_60);
                }
                else {
                  top = local_60;
                }
              }
              else {
                top = next;
              }
            }
          }
        }
      }
      ActiveEdgeList::rewind(ael,(FILE *)p);
      split_edge(this,left,top,ael,(Vertex **)p);
      split_edge(this,right,top,ael,(Vertex **)p);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = intersect_pair_edge(this,left,right,ael,(Vertex **)p);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Triangulation::check_intersection(Edge* left, Edge* right,
                                       ActiveEdgeList* ael, Vertex** current) {
  if (!left || !right) {
    return false;
  }

  glm::vec2 p;

  if (left->intersect(right, &p) && !glm::isinf(p.x) && !glm::isinf(p.y)) {
    Vertex* v;
    Vertex* top = *current;

    // the vertex in mesh is sorted, so walk to prev can find latest top point
    while (top && VertexCompare::Compare(p, top->point)) {
      top = top->prev;
    }

    if (p == left->top->point) {
      v = left->top;
    } else if (p == left->bottom->point) {
      v = left->bottom;
    } else if (p == right->top->point) {
      v = right->top;
    } else if (p == right->bottom->point) {
      v = right->bottom;
    } else {
      // intersect point is between start and end point
      // need to insert new vertex
      auto prev = top;
      while (prev && VertexCompare::Compare(p, prev->point)) {
        prev = prev->prev;
      }

      auto next = prev ? prev->next : mesh_.head;
      while (next && VertexCompare::Compare(next->point, p)) {
        prev = next;
        next = next->next;
      }

      // check if point is already in mesh
      if (prev && prev->point == p) {
        v = prev;
      } else if (next && next->point == p) {
        v = next;
      } else {
        v = heap_.Allocate<Vertex>(p);
        v->point = p;

        mesh_.insert(v, prev, next);
      }
    }
    ael->rewind(current, top ? top : v);

    split_edge(left, v, ael, current);
    split_edge(right, v, ael, current);
    return true;
  }

  return intersect_pair_edge(left, right, ael, current);
}